

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psnr.c
# Opt level: O3

int64_t aom_get_sse_plane(YV12_BUFFER_CONFIG *a,YV12_BUFFER_CONFIG *b,int plane,int highbd)

{
  int64_t iVar1;
  uint8_t *puVar2;
  int iVar3;
  uint8_t *puVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  
  if (highbd == 0) {
    if (plane == 2) {
      puVar2 = (a->field_5).field_0.v_buffer;
      iVar7 = (a->field_4).field_0.uv_stride;
      puVar4 = (b->field_5).field_0.v_buffer;
    }
    else {
      if (plane != 1) {
        if (plane != 0) {
          return 0;
        }
        puVar2 = (a->field_5).field_0.y_buffer;
        iVar7 = (a->field_4).field_0.y_stride;
        puVar4 = (b->field_5).field_0.y_buffer;
        iVar3 = (b->field_4).field_0.y_stride;
        iVar5 = (a->field_2).field_0.y_crop_width;
        iVar6 = (a->field_3).field_0.y_crop_height;
        goto LAB_00272d4d;
      }
      puVar2 = (a->field_5).field_0.u_buffer;
      iVar7 = (a->field_4).field_0.uv_stride;
      puVar4 = (b->field_5).field_0.u_buffer;
    }
    iVar3 = (b->field_4).field_0.uv_stride;
    iVar5 = (a->field_2).field_0.uv_crop_width;
    iVar6 = (a->field_3).field_0.uv_crop_height;
LAB_00272d4d:
    iVar1 = get_sse(puVar2,iVar7,puVar4,iVar3,iVar5,iVar6);
    return iVar1;
  }
  if (plane == 2) {
    puVar2 = (a->field_5).field_0.v_buffer;
    iVar7 = (a->field_4).field_0.uv_stride;
    puVar4 = (b->field_5).field_0.v_buffer;
  }
  else {
    if (plane != 1) {
      if (plane != 0) {
        return 0;
      }
      puVar2 = (a->field_5).field_0.y_buffer;
      iVar7 = (a->field_4).field_0.y_stride;
      puVar4 = (b->field_5).field_0.y_buffer;
      iVar3 = (b->field_4).field_0.y_stride;
      iVar5 = (a->field_2).field_0.y_crop_width;
      iVar6 = (a->field_3).field_0.y_crop_height;
      goto LAB_00272d1d;
    }
    puVar2 = (a->field_5).field_0.u_buffer;
    iVar7 = (a->field_4).field_0.uv_stride;
    puVar4 = (b->field_5).field_0.u_buffer;
  }
  iVar3 = (b->field_4).field_0.uv_stride;
  iVar5 = (a->field_2).field_0.uv_crop_width;
  iVar6 = (a->field_3).field_0.uv_crop_height;
LAB_00272d1d:
  iVar1 = highbd_get_sse(puVar2,iVar7,puVar4,iVar3,iVar5,iVar6);
  return iVar1;
}

Assistant:

int64_t aom_get_sse_plane(const YV12_BUFFER_CONFIG *a,
                          const YV12_BUFFER_CONFIG *b, int plane, int highbd) {
#if CONFIG_AV1_HIGHBITDEPTH
  if (highbd) {
    switch (plane) {
      case 0: return aom_highbd_get_y_sse(a, b);
      case 1: return aom_highbd_get_u_sse(a, b);
      case 2: return aom_highbd_get_v_sse(a, b);
      default: assert(plane >= 0 && plane <= 2); return 0;
    }
  } else {
    switch (plane) {
      case 0: return aom_get_y_sse(a, b);
      case 1: return aom_get_u_sse(a, b);
      case 2: return aom_get_v_sse(a, b);
      default: assert(plane >= 0 && plane <= 2); return 0;
    }
  }
#else
  (void)highbd;
  switch (plane) {
    case 0: return aom_get_y_sse(a, b);
    case 1: return aom_get_u_sse(a, b);
    case 2: return aom_get_v_sse(a, b);
    default: assert(plane >= 0 && plane <= 2); return 0;
  }
#endif
}